

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_equality_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *pEVar2;
  Expression *pEVar3;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_relational_expression(this);
  while( true ) {
    while( true ) {
      bVar1 = match(this,TK_EQ);
      if (!bVar1) break;
      Token::operator=(&oper,(this->matched)._M_current);
      pEVar2 = (Expression *)operator_new(0x68);
      pEVar3 = parse_relational_expression(this);
      EqualExpression::EqualExpression((EqualExpression *)pEVar2,&oper,left,pEVar3);
      left = pEVar2;
    }
    bVar1 = match(this,TK_NE);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    pEVar2 = (Expression *)operator_new(0x68);
    pEVar3 = parse_relational_expression(this);
    NotEqualExpression::NotEqualExpression((NotEqualExpression *)pEVar2,&oper,left,pEVar3);
    left = pEVar2;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression*Parser::parse_equality_expression() {
    Token oper;
    Expression* expression = parse_relational_expression();

    while (true) {
        if (match(TK_EQ)) {
            oper = *matched;
            expression = new EqualExpression(oper, expression, parse_relational_expression());
        } else if (match(TK_NE)) {
            oper = *matched;
            expression = new NotEqualExpression(oper, expression, parse_relational_expression());
        } else {
            break;
        }
    }

    return expression;
}